

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 GenStateCompileSwitchBlock(jx9_gen_state *pGen,sxu32 *pBlockStart)

{
  byte bVar1;
  SyToken *pSVar2;
  sxi32 sVar3;
  SyToken *pSVar4;
  
  pSVar4 = pGen->pIn;
  sVar3 = 0;
  if (pSVar4 < pGen->pEnd) {
    bVar1 = *(byte *)((long)&pSVar4->nType + 2);
    sVar3 = 0;
    while ((bVar1 & 0x14) == 0) {
      sVar3 = jx9GenCompileError(pGen,1,pSVar4->nLine,"Unexpected token \'%z\'");
      if (sVar3 == -10) {
        return -10;
      }
      pSVar2 = pGen->pIn;
      pSVar4 = pSVar2 + 1;
      pGen->pIn = pSVar4;
      if (pGen->pEnd <= pSVar4) break;
      bVar1 = *(byte *)((long)&pSVar2[1].nType + 2);
    }
  }
  pGen->pIn = pSVar4 + 1;
  *pBlockStart = pGen->pVm->pByteContainer->nUsed;
  do {
    pSVar4 = pGen->pIn;
    if (pGen->pEnd <= pSVar4) {
      return sVar3;
    }
    if ((pSVar4->nType & 4) == 0) {
      if ((char)pSVar4->nType < '\0') {
        return -0x12;
      }
    }
    else {
      if (*(int *)&pSVar4->pUserData == 5) {
        return 0;
      }
      if (*(int *)&pSVar4->pUserData == 10) {
        return 0;
      }
    }
    sVar3 = jx9CompileBlock(pGen);
    if (sVar3 == -10) {
      return -10;
    }
  } while( true );
}

Assistant:

static sxi32 GenStateCompileSwitchBlock(jx9_gen_state *pGen,sxu32 *pBlockStart)
{
	sxi32 rc = SXRET_OK;
	while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & (JX9_TK_SEMI/*';'*/|JX9_TK_COLON/*':'*/)) == 0 ){
		/* Unexpected token */
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "Unexpected token '%z'", &pGen->pIn->sData);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		pGen->pIn++;
	}
	pGen->pIn++;
	/* First instruction to execute in this block. */
	*pBlockStart = jx9VmInstrLength(pGen->pVm);
	/* Compile the block until we hit a case/default/endswitch keyword
	 * or the '}' token */
	for(;;){
		if( pGen->pIn >= pGen->pEnd ){
			/* No more input to process */
			break;
		}
		rc = SXRET_OK;
		if( (pGen->pIn->nType & JX9_TK_KEYWORD) == 0 ){
			if( pGen->pIn->nType & JX9_TK_CCB /*'}' */ ){
				rc = SXERR_EOF;
				break;
			}
		}else{
			sxi32 nKwrd;
			/* Extract the keyword */
			nKwrd = SX_PTR_TO_INT(pGen->pIn->pUserData);
			if( nKwrd == JX9_TKWRD_CASE || nKwrd == JX9_TKWRD_DEFAULT ){
				break;
			}
		}
		/* Compile block */
		rc = jx9CompileBlock(&(*pGen));
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
	}
	return rc;
}